

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O0

int Abc_NtkRR(Abc_Ntk_t *pNtk,int nFaninLevels,int nFanoutLevels,int fUseFanouts,int fVerbose)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  Abc_RRMan_t *p_00;
  ProgressBar *p_01;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar4;
  abctime aVar5;
  Abc_Obj_t *pAVar6;
  abctime aVar7;
  abctime clkTotal;
  abctime clk;
  int RetValue;
  int nNodes;
  int m;
  int k;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode;
  Abc_RRMan_t *p;
  ProgressBar *pProgress;
  int fVerbose_local;
  int fUseFanouts_local;
  int nFanoutLevels_local;
  int nFaninLevels_local;
  Abc_Ntk_t *pNtk_local;
  
  aVar3 = Abc_Clock();
  p_00 = Abc_RRManStart();
  p_00->pNtk = pNtk;
  p_00->nFaninLevels = nFaninLevels;
  p_00->nFanoutLevels = nFanoutLevels;
  iVar1 = Abc_NtkNodeNum(pNtk);
  p_00->nNodesOld = iVar1;
  iVar1 = Abc_AigLevel(pNtk);
  p_00->nLevelsOld = iVar1;
  Abc_NtkCleanCopy(pNtk);
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Abc_NtkRRSimulateStart(pNtk);
  p_01 = Extra_ProgressBarStart(_stdout,iVar1);
  for (m = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), m < iVar2; m = m + 1) {
    pObj = Abc_NtkObj(pNtk,m);
    if ((pObj != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pObj), iVar2 != 0)) {
      Extra_ProgressBarUpdate(p_01,m,(char *)0x0);
      if (iVar1 <= m) break;
      iVar2 = Abc_NodeIsPersistant(pObj);
      if ((iVar2 == 0) && (iVar2 = Abc_ObjFanoutNum(pObj), iVar2 < 0x3e9)) {
        if (fUseFanouts == 0) {
          for (nNodes = 0; iVar2 = Abc_ObjFaninNum(pObj), nNodes < iVar2; nNodes = nNodes + 1) {
            pAVar4 = Abc_ObjFanin(pObj,nNodes);
            iVar2 = Abc_ObjFanoutNum(pAVar4);
            if (iVar2 != 1) {
              p_00->nEdgesTried = p_00->nEdgesTried + 1;
              Abc_RRManClean(p_00);
              p_00->pNode = pObj;
              p_00->pFanin = pAVar4;
              p_00->pFanout = (Abc_Obj_t *)0x0;
              aVar7 = Abc_Clock();
              iVar2 = Abc_NtkRRWindow(p_00);
              aVar5 = Abc_Clock();
              p_00->timeWindow = (aVar5 - aVar7) + p_00->timeWindow;
              if (iVar2 != 0) {
                aVar7 = Abc_Clock();
                iVar2 = Abc_NtkRRProve(p_00);
                aVar5 = Abc_Clock();
                p_00->timeMiter = (aVar5 - aVar7) + p_00->timeMiter;
                if (iVar2 != 0) {
                  aVar7 = Abc_Clock();
                  Abc_NtkRRUpdate(pNtk,p_00->pNode,p_00->pFanin,p_00->pFanout);
                  aVar5 = Abc_Clock();
                  p_00->timeUpdate = (aVar5 - aVar7) + p_00->timeUpdate;
                  p_00->nEdgesRemoved = p_00->nEdgesRemoved + 1;
                  break;
                }
              }
            }
          }
        }
        else {
          for (nNodes = 0; iVar2 = Abc_ObjFaninNum(pObj), nNodes < iVar2; nNodes = nNodes + 1) {
            pAVar4 = Abc_ObjFanin(pObj,nNodes);
            for (RetValue = 0; iVar2 = Abc_ObjFanoutNum(pObj), RetValue < iVar2;
                RetValue = RetValue + 1) {
              pAVar6 = Abc_ObjFanout(pObj,RetValue);
              p_00->nEdgesTried = p_00->nEdgesTried + 1;
              Abc_RRManClean(p_00);
              p_00->pNode = pObj;
              p_00->pFanin = pAVar4;
              p_00->pFanout = pAVar6;
              aVar7 = Abc_Clock();
              iVar2 = Abc_NtkRRWindow(p_00);
              aVar5 = Abc_Clock();
              p_00->timeWindow = (aVar5 - aVar7) + p_00->timeWindow;
              if (iVar2 != 0) {
                aVar7 = Abc_Clock();
                iVar2 = Abc_NtkRRProve(p_00);
                aVar5 = Abc_Clock();
                p_00->timeMiter = (aVar5 - aVar7) + p_00->timeMiter;
                if (iVar2 != 0) {
                  aVar7 = Abc_Clock();
                  Abc_NtkRRUpdate(pNtk,p_00->pNode,p_00->pFanin,p_00->pFanout);
                  aVar5 = Abc_Clock();
                  p_00->timeUpdate = (aVar5 - aVar7) + p_00->timeUpdate;
                  p_00->nEdgesRemoved = p_00->nEdgesRemoved + 1;
                  break;
                }
              }
            }
          }
        }
      }
    }
  }
  Abc_NtkRRSimulateStop(pNtk);
  Extra_ProgressBarStop(p_01);
  aVar7 = Abc_Clock();
  p_00->timeTotal = aVar7 - aVar3;
  if (fVerbose != 0) {
    Abc_RRManPrintStats(p_00);
  }
  Abc_RRManStop(p_00);
  Abc_NtkReassignIds(pNtk);
  Abc_NtkLevel(pNtk);
  iVar1 = Abc_NtkCheck(pNtk);
  if (iVar1 == 0) {
    printf("Abc_NtkRR: The network check has failed.\n");
  }
  pNtk_local._4_4_ = (uint)(iVar1 != 0);
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkRR( Abc_Ntk_t * pNtk, int nFaninLevels, int nFanoutLevels, int fUseFanouts, int fVerbose )
{
    ProgressBar * pProgress;
    Abc_RRMan_t * p;
    Abc_Obj_t * pNode, * pFanin, * pFanout;
    int i, k, m, nNodes, RetValue;
    abctime clk, clkTotal = Abc_Clock();
    // start the manager
    p = Abc_RRManStart();
    p->pNtk          = pNtk;
    p->nFaninLevels  = nFaninLevels;
    p->nFanoutLevels = nFanoutLevels;
    p->nNodesOld     = Abc_NtkNodeNum(pNtk);
    p->nLevelsOld    = Abc_AigLevel(pNtk);
    // remember latch values
//    Abc_NtkForEachLatch( pNtk, pNode, i )
//        pNode->pNext = pNode->pData;
    // go through the nodes
    Abc_NtkCleanCopy(pNtk);
    nNodes = Abc_NtkObjNumMax(pNtk);
    Abc_NtkRRSimulateStart(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // stop if all nodes have been tried once
        if ( i >= nNodes )
            break;
        // skip the constant node
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        // skip persistant nodes
        if ( Abc_NodeIsPersistant(pNode) )
            continue;
        // skip the nodes with many fanouts
        if ( Abc_ObjFanoutNum(pNode) > 1000 )
            continue;
        // construct the window
        if ( !fUseFanouts )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
            {
                // skip the nodes with only one fanout (tree nodes)
                if ( Abc_ObjFanoutNum(pFanin) == 1 )
                    continue;
/*
                if ( pFanin->Id == 228 && pNode->Id == 2649 )
                {
                    int k = 0;
                }
*/
                p->nEdgesTried++;
                Abc_RRManClean( p );
                p->pNode   = pNode;
                p->pFanin  = pFanin;
                p->pFanout = NULL;

                clk = Abc_Clock();
                RetValue = Abc_NtkRRWindow( p );
                p->timeWindow += Abc_Clock() - clk;
                if ( !RetValue )
                    continue;
/*
                if ( pFanin->Id == 228 && pNode->Id == 2649 )
                {
                    Abc_NtkShowAig( p->pWnd, 0 );
                }
*/
                clk = Abc_Clock();
                RetValue = Abc_NtkRRProve( p );
                p->timeMiter += Abc_Clock() - clk;
                if ( !RetValue )
                    continue;
//printf( "%d -> %d (%d)\n", pFanin->Id, pNode->Id, k );

                clk = Abc_Clock();
                Abc_NtkRRUpdate( pNtk, p->pNode, p->pFanin, p->pFanout );
                p->timeUpdate += Abc_Clock() - clk;

                p->nEdgesRemoved++;
                break;
            }
            continue;
        }
        // use the fanouts
        Abc_ObjForEachFanin( pNode, pFanin, k )
        Abc_ObjForEachFanout( pNode, pFanout, m )
        {
            // skip the nodes with only one fanout (tree nodes)
//            if ( Abc_ObjFanoutNum(pFanin) == 1 && Abc_ObjFanoutNum(pNode) == 1 )
//                continue;

            p->nEdgesTried++;
            Abc_RRManClean( p );
            p->pNode   = pNode;
            p->pFanin  = pFanin;
            p->pFanout = pFanout;

            clk = Abc_Clock();
            RetValue = Abc_NtkRRWindow( p );
            p->timeWindow += Abc_Clock() - clk;
            if ( !RetValue )
                continue;

            clk = Abc_Clock();
            RetValue = Abc_NtkRRProve( p );
            p->timeMiter += Abc_Clock() - clk;
            if ( !RetValue )
                continue;

            clk = Abc_Clock();
            Abc_NtkRRUpdate( pNtk, p->pNode, p->pFanin, p->pFanout );
            p->timeUpdate += Abc_Clock() - clk;

            p->nEdgesRemoved++;
            break;
        }
    }
    Abc_NtkRRSimulateStop(pNtk);
    Extra_ProgressBarStop( pProgress );
    p->timeTotal = Abc_Clock() - clkTotal;
    if ( fVerbose )
        Abc_RRManPrintStats( p );
    Abc_RRManStop( p );
    // restore latch values
//    Abc_NtkForEachLatch( pNtk, pNode, i )
//        pNode->pData = pNode->pNext, pNode->pNext = NULL;
    // put the nodes into the DFS order and reassign their IDs
    Abc_NtkReassignIds( pNtk );
    Abc_NtkLevel( pNtk );
    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkRR: The network check has failed.\n" );
        return 0;
    }
    return 1;
}